

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

void __thiscall cmCTestSubmitHandler::ResponseParser::EndElement(ResponseParser *this,string *name)

{
  int iVar1;
  string *this_00;
  string status;
  string local_50;
  string local_30;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    GetCurrentValue_abi_cxx11_(&local_30,this);
    cmsys::SystemTools::UpperCase(&local_50,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&local_50), iVar1 == 0)) {
      this->Status = STATUS_OK;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar1 == 0) {
        this->Status = STATUS_WARNING;
      }
      else {
        this->Status = STATUS_ERROR;
      }
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      GetCurrentValue_abi_cxx11_(&local_50,this);
      this_00 = (string *)&this->Filename;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        GetCurrentValue_abi_cxx11_(&local_50,this);
        this_00 = (string *)&this->MD5;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          GetCurrentValue_abi_cxx11_(&local_50,this);
          this_00 = (string *)&this->Message;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 != 0) {
            return;
          }
          GetCurrentValue_abi_cxx11_(&local_50,this);
          this_00 = (string *)&this->BuildID;
        }
      }
    }
    std::__cxx11::string::operator=(this_00,(string *)&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "status") {
      std::string status = cmSystemTools::UpperCase(this->GetCurrentValue());
      if (status == "OK" || status == "SUCCESS") {
        this->Status = STATUS_OK;
      } else if (status == "WARNING") {
        this->Status = STATUS_WARNING;
      } else {
        this->Status = STATUS_ERROR;
      }
    } else if (name == "filename") {
      this->Filename = this->GetCurrentValue();
    } else if (name == "md5") {
      this->MD5 = this->GetCurrentValue();
    } else if (name == "message") {
      this->Message = this->GetCurrentValue();
    } else if (name == "buildId") {
      this->BuildID = this->GetCurrentValue();
    }
  }